

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

void __thiscall serialize_tests::class_methods::test_method(class_methods *this)

{
  long lVar1;
  string stringvalin;
  string stringvalin_00;
  readonly_property<bool> rVar2;
  undefined1 *__nbytes;
  difference_type __offset;
  CTransactionRef *txvalin;
  char *args_3;
  iterator pvVar3;
  CTransactionRef *pCVar4;
  ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *args_4;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  check_type cVar6;
  undefined8 in_stack_fffffffffffffb68;
  undefined8 in_stack_fffffffffffffb70;
  undefined8 in_stack_fffffffffffffb78;
  undefined8 in_stack_fffffffffffffb80;
  undefined1 *local_478;
  undefined1 *local_470;
  char *local_468;
  char *local_460;
  undefined1 local_451;
  lazy_ostream local_450;
  undefined1 *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  byte out_3;
  DataStream ds;
  char *local_3e8;
  char *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  char *local_3c8;
  char *local_3c0;
  DataStream ss2;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  DataStream ss;
  CTransactionRef tx_ref;
  CMutableTransaction txval;
  undefined1 *local_268;
  assertion_result local_260;
  undefined1 **local_248;
  byte *local_240;
  uint8_t obj;
  undefined1 auStack_237 [7];
  DataStream *local_230;
  undefined1 *local_228;
  DataStream *local_220;
  char *local_218;
  char *local_210;
  assertion_result local_208;
  array<std::byte,_2UL> out;
  string in;
  CSerializeMethodsTestMany methodtest4;
  CSerializeMethodsTestSingle methodtest3;
  long *local_138 [2];
  long local_128 [2];
  CSerializeMethodsTestMany methodtest2;
  long *local_d0 [2];
  long local_c0 [2];
  CSerializeMethodsTestSingle methodtest1;
  uint8_t charstrval [16];
  string stringval;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  stringval._M_dataplus._M_p = (pointer)&stringval.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&stringval,"testing","");
  builtin_memcpy(charstrval,"testing charstr",0x10);
  CMutableTransaction::CMutableTransaction(&txval);
  tx_ref.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction&>
            (&tx_ref.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (CTransaction **)&tx_ref,(allocator<CTransaction> *)&methodtest1,&txval);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,stringval._M_dataplus._M_p,
             stringval._M_dataplus._M_p + stringval._M_string_length);
  stringvalin._M_string_length = in_stack_fffffffffffffb70;
  stringvalin._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
  stringvalin.field_2._M_allocated_capacity = in_stack_fffffffffffffb78;
  stringvalin.field_2._8_8_ = in_stack_fffffffffffffb80;
  CSerializeMethodsTestSingle::CSerializeMethodsTestSingle
            (&methodtest1,100,true,stringvalin,(uint8_t *)local_d0,(CTransactionRef *)charstrval);
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_138[0] = local_128;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_138,stringval._M_dataplus._M_p,
             stringval._M_dataplus._M_p + stringval._M_string_length);
  txvalin = (CTransactionRef *)charstrval;
  pCVar4 = &tx_ref;
  stringvalin_00._M_string_length = in_stack_fffffffffffffb70;
  stringvalin_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffb68;
  stringvalin_00.field_2._M_allocated_capacity = in_stack_fffffffffffffb78;
  stringvalin_00.field_2._8_8_ = in_stack_fffffffffffffb80;
  CSerializeMethodsTestSingle::CSerializeMethodsTestSingle
            (&methodtest2.super_CSerializeMethodsTestSingle,100,true,stringvalin_00,
             (uint8_t *)local_138,txvalin);
  if (local_138[0] != local_128) {
    operator_delete(local_138[0],local_128[0] + 1);
  }
  methodtest3.stringval._M_dataplus._M_p = (pointer)&methodtest3.stringval.field_2;
  methodtest3.stringval._M_string_length = 0;
  methodtest3.stringval.field_2._M_local_buf[0] = '\0';
  methodtest3.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  methodtest3.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  methodtest4.super_CSerializeMethodsTestSingle.stringval._M_dataplus._M_p =
       (pointer)&methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2;
  methodtest4.super_CSerializeMethodsTestSingle.stringval._M_string_length = 0;
  methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2._M_local_buf[0] = '\0';
  methodtest4.super_CSerializeMethodsTestSingle.txval.
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  methodtest4.super_CSerializeMethodsTestSingle.txval.
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss.m_read_pos = 0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ss.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x100;
  file.m_begin = (iterator)&local_2e8;
  msg.m_end = (iterator)pCVar4;
  msg.m_begin = (iterator)txvalin;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2f8,msg);
  _cVar6 = 0x6234c0;
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)
       CSerializeMethodsTestSingle::operator==
                 (&methodtest1,&methodtest2.super_CSerializeMethodsTestSingle);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_16d3970;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf35871;
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d3df0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_300 = "";
  local_220 = &ss2;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&obj,1,0,WARN,_cVar6,(size_t)&local_308,0x100);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  CSerializeMethodsTestSingle::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle_const,ActionSerialize>
            (&methodtest1,&ss);
  local_230 = (DataStream *)&methodtest4.super_CSerializeMethodsTestSingle.txval;
  _obj = &::TX_WITH_WITNESS;
  ActionUnserialize::
  SerReadWriteMany<DataStream,int&,bool&,std::__cxx11::string&,char(&)[16],ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>>>
            (&ss,(int *)&methodtest4,&methodtest4.super_CSerializeMethodsTestSingle.boolval,
             &methodtest4.super_CSerializeMethodsTestSingle.stringval,
             &methodtest4.super_CSerializeMethodsTestSingle.charstrval,
             (ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> *)&obj);
  args_3 = methodtest2.super_CSerializeMethodsTestSingle.charstrval;
  local_230 = (DataStream *)&methodtest2.super_CSerializeMethodsTestSingle.txval;
  args_4 = (ParamsWrapper<TransactionSerParams,_const_std::shared_ptr<const_CTransaction>_> *)&obj;
  _obj = &::TX_WITH_WITNESS;
  SerializeMany<DataStream,int,bool,std::__cxx11::string,char[16],ParamsWrapper<TransactionSerParams,std::shared_ptr<CTransaction_const>const>>
            (&ss,(int *)&methodtest2,&methodtest2.super_CSerializeMethodsTestSingle.boolval,
             &methodtest2.super_CSerializeMethodsTestSingle.stringval,&args_3,args_4);
  CSerializeMethodsTestSingle::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle,ActionUnserialize>
            (&methodtest3,&ss);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x105;
  file_00.m_begin = (iterator)&local_318;
  msg_00.m_end = (iterator)args_4;
  msg_00.m_begin = args_3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_328,
             msg_00);
  _cVar6 = 0x623652;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSerializeMethodsTestSingle::operator==
                 (&methodtest1,&methodtest2.super_CSerializeMethodsTestSingle);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_16d3970;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf35871;
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d3df0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_330 = "";
  pvVar3 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_220 = &ss2;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&obj,1,0,WARN,_cVar6,(size_t)&local_338,0x105);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x106;
  file_01.m_begin = (iterator)&local_348;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_358,
             msg_01);
  _cVar6 = 0x62371d;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSerializeMethodsTestSingle::operator==
                 (&methodtest2.super_CSerializeMethodsTestSingle,&methodtest3);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_16d398a;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf3588c;
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d3df0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_360 = "";
  pvVar3 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_220 = &ss2;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&obj,1,0,WARN,_cVar6,(size_t)&local_368,0x106);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x107;
  file_02.m_begin = (iterator)&local_378;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_388,
             msg_02);
  _cVar6 = 0x6237f6;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSerializeMethodsTestSingle::operator==
                 (&methodtest3,&methodtest4.super_CSerializeMethodsTestSingle);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_16d3996;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf358a7;
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d3df0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_390 = "";
  pvVar3 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_220 = &ss2;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&obj,1,0,WARN,_cVar6,(size_t)&local_398,0x107);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ss2.m_read_pos = 0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _obj = (TransactionSerParams *)CONCAT44(auStack_237._3_4_,100);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&ss2,0,&obj);
  _obj = (TransactionSerParams *)CONCAT71(auStack_237,1);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&ss2,
             ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&obj);
  Serialize<DataStream,char>(&ss2,&stringval);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&ss2,
             ss2.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,charstrval,&stringval);
  _obj = &::TX_WITH_WITNESS;
  local_230 = &ss2;
  SerializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
            (&txval,(ParamsStream<DataStream_&,_TransactionSerParams> *)&obj,&::TX_WITH_WITNESS);
  CSerializeMethodsTestSingle::
  SerializationOps<DataStream,serialize_tests::CSerializeMethodsTestSingle,ActionUnserialize>
            (&methodtest3,&ss2);
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_3c0 = "";
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x10c;
  file_03.m_begin = (iterator)&local_3c8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3d8,
             msg_03);
  _cVar6 = 0x623991;
  local_260.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CSerializeMethodsTestSingle::operator==
                 (&methodtest3,&methodtest4.super_CSerializeMethodsTestSingle);
  local_260.m_message.px = (element_type *)0x0;
  local_260.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_220 = &ds;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_16d3996;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0xf358a7;
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d3df0;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_3e0 = "";
  pvVar3 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_260,(lazy_ostream *)&obj,1,0,WARN,_cVar6,(size_t)&local_3e8,0x10c);
  boost::detail::shared_count::~shared_count(&local_260.m_message.pn);
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ds.m_read_pos = 0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in._M_dataplus._M_p = (pointer)&in.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&in,"ab","");
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&ds,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,in._M_dataplus._M_p,
             in._M_dataplus._M_p + in._M_string_length);
  __nbytes = auStack_237;
  _obj = (TransactionSerParams *)CONCAT71(auStack_237,99);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)&ds,
             ds.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&obj);
  DataStream::read(&ds,(int)&out,(void *)0x2,(size_t)__nbytes);
  DataStream::read(&ds,(int)&obj,(void *)0x1,(size_t)__nbytes);
  out_3 = obj;
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x114;
  file_04.m_begin = (iterator)&local_420;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_430,
             msg_04);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = "";
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(out._M_elems[0] == 0x61);
  local_268 = &local_451;
  local_451 = 0x61;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_210 = "";
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d5580;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d5580;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_248 = &local_268;
  local_240 = out._M_elems;
  local_220 = (DataStream *)&local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_450,1,2,REQUIRE,0xf358a8,(size_t)&local_218,0x114,&obj,
             "std::byte{\'a\'}",&local_260);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_460 = "";
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x115;
  file_05.m_begin = (iterator)&local_468;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_478,
             msg_05);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = "";
  local_240 = out._M_elems + 1;
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(out._M_elems[1] == 0x62);
  local_451 = 0x62;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_210 = "";
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d5580;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_268 = &local_451;
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d5580;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar3 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_248 = &local_268;
  local_220 = (DataStream *)&local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_450,1,2,REQUIRE,0xf358c1,(size_t)&local_218,0x115,&obj,
             "std::byte{\'b\'}",&local_260);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  file_06.m_end = (iterator)0x116;
  file_06.m_begin = &stack0xfffffffffffffb78;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
             (size_t)&stack0xfffffffffffffb68,msg_06);
  local_450.m_empty = false;
  local_450._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013d3cb0;
  local_440 = boost::unit_test::lazy_ostream::inst;
  local_438 = "";
  local_240 = &out_3;
  local_208.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(out_3 == 99);
  local_451 = 99;
  local_208.m_message.px = (element_type *)0x0;
  local_208.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/serialize_tests.cpp"
  ;
  local_210 = "";
  local_230 = (DataStream *)((ulong)local_230 & 0xffffffffffffff00);
  _obj = (TransactionSerParams *)&PTR__lazy_ostream_013d5580;
  local_228 = boost::unit_test::lazy_ostream::inst;
  local_268 = &local_451;
  local_260.m_message.px = (element_type *)((ulong)local_260.m_message.px & 0xffffffffffffff00);
  local_260._0_8_ = &PTR__lazy_ostream_013d5580;
  local_260.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_248 = &local_268;
  local_220 = (DataStream *)&local_240;
  boost::test_tools::tt_detail::report_assertion
            (&local_208,&local_450,1,2,REQUIRE,0xf358da,(size_t)&local_218,0x116,&obj,
             "std::byte{\'c\'}",&local_260);
  boost::detail::shared_count::~shared_count(&local_208.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in._M_dataplus._M_p != &in.field_2) {
    operator_delete(in._M_dataplus._M_p,in.field_2._M_allocated_capacity + 1);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ds);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss2);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&ss);
  if (methodtest4.super_CSerializeMethodsTestSingle.txval.
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (methodtest4.super_CSerializeMethodsTestSingle.txval.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)methodtest4.super_CSerializeMethodsTestSingle.stringval._M_dataplus._M_p !=
      &methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2) {
    operator_delete(methodtest4.super_CSerializeMethodsTestSingle.stringval._M_dataplus._M_p,
                    CONCAT71(methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2.
                             _M_allocated_capacity._1_7_,
                             methodtest4.super_CSerializeMethodsTestSingle.stringval.field_2.
                             _M_local_buf[0]) + 1);
  }
  if (methodtest3.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (methodtest3.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)methodtest3.stringval._M_dataplus._M_p != &methodtest3.stringval.field_2) {
    operator_delete(methodtest3.stringval._M_dataplus._M_p,
                    CONCAT71(methodtest3.stringval.field_2._M_allocated_capacity._1_7_,
                             methodtest3.stringval.field_2._M_local_buf[0]) + 1);
  }
  if (methodtest2.super_CSerializeMethodsTestSingle.txval.
      super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (methodtest2.super_CSerializeMethodsTestSingle.txval.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)methodtest2.super_CSerializeMethodsTestSingle.stringval._M_dataplus._M_p !=
      &methodtest2.super_CSerializeMethodsTestSingle.stringval.field_2) {
    operator_delete(methodtest2.super_CSerializeMethodsTestSingle.stringval._M_dataplus._M_p,
                    methodtest2.super_CSerializeMethodsTestSingle.stringval.field_2.
                    _M_allocated_capacity + 1);
  }
  if (methodtest1.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (methodtest1.txval.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)methodtest1.stringval._M_dataplus._M_p != &methodtest1.stringval.field_2) {
    operator_delete(methodtest1.stringval._M_dataplus._M_p,
                    methodtest1.stringval.field_2._M_allocated_capacity + 1);
  }
  if (tx_ref.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (tx_ref.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&txval.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&txval.vin);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)stringval._M_dataplus._M_p != &stringval.field_2) {
    operator_delete(stringval._M_dataplus._M_p,stringval.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(class_methods)
{
    int intval(100);
    bool boolval(true);
    std::string stringval("testing");
    const uint8_t charstrval[16]{"testing charstr"};
    CMutableTransaction txval;
    CTransactionRef tx_ref{MakeTransactionRef(txval)};
    CSerializeMethodsTestSingle methodtest1(intval, boolval, stringval, charstrval, tx_ref);
    CSerializeMethodsTestMany methodtest2(intval, boolval, stringval, charstrval, tx_ref);
    CSerializeMethodsTestSingle methodtest3;
    CSerializeMethodsTestMany methodtest4;
    DataStream ss;
    BOOST_CHECK(methodtest1 == methodtest2);
    ss << methodtest1;
    ss >> methodtest4;
    ss << methodtest2;
    ss >> methodtest3;
    BOOST_CHECK(methodtest1 == methodtest2);
    BOOST_CHECK(methodtest2 == methodtest3);
    BOOST_CHECK(methodtest3 == methodtest4);

    DataStream ss2;
    ss2 << intval << boolval << stringval << charstrval << TX_WITH_WITNESS(txval);
    ss2 >> methodtest3;
    BOOST_CHECK(methodtest3 == methodtest4);
    {
        DataStream ds;
        const std::string in{"ab"};
        ds << Span{in} << std::byte{'c'};
        std::array<std::byte, 2> out;
        std::byte out_3;
        ds >> Span{out} >> out_3;
        BOOST_CHECK_EQUAL(out.at(0), std::byte{'a'});
        BOOST_CHECK_EQUAL(out.at(1), std::byte{'b'});
        BOOST_CHECK_EQUAL(out_3, std::byte{'c'});
    }
}